

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc_state_machine.hxx
# Opt level: O1

bool __thiscall
calc_server::calc_state_machine::apply_snapshot(calc_state_machine *this,snapshot *s)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  _Base_ptr this_00;
  int iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->snapshots_lock_);
  if (iVar3 == 0) {
    uVar2 = s->last_log_idx_;
    p_Var1 = &(this->snapshots_)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->snapshots_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < uVar2]) {
      if (*(ulong *)(p_Var5 + 1) >= uVar2) {
        p_Var4 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, uVar2 < *(ulong *)(p_Var4 + 1)))
    {
      p_Var5 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      p_Var4 = p_Var5[1]._M_parent;
      this_00 = p_Var5[1]._M_left;
      if (this_00 == (_Base_ptr)0x0) {
        LOCK();
        (this->cur_value_).super___atomic_base<long>._M_i = (__int_type_conflict2)p_Var4->_M_left;
        UNLOCK();
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        }
        LOCK();
        (this->cur_value_).super___atomic_base<long>._M_i = (__int_type_conflict2)p_Var4->_M_left;
        UNLOCK();
        if (this_00 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->snapshots_lock_);
    return (_Rb_tree_header *)p_Var5 != p_Var1;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool apply_snapshot(snapshot& s) {
        std::lock_guard<std::mutex> ll(snapshots_lock_);
        auto entry = snapshots_.find(s.get_last_log_idx());
        if (entry == snapshots_.end()) return false;

        ptr<snapshot_ctx> ctx = entry->second;
        cur_value_ = ctx->value_;
        return true;
    }